

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefines.h
# Opt level: O0

void __thiscall soplex::Tolerances::Tolerances(Tolerances *this)

{
  Tolerances *this_local;
  
  this->s_epsilon = 1e-16;
  this->s_epsilon_factorization = 1e-20;
  this->s_epsilon_update = 1e-16;
  this->s_epsilon_pivot = 1e-10;
  this->s_feastol = 1e-06;
  this->s_opttol = 1e-06;
  this->s_floating_point_feastol = 1e-06;
  this->s_floating_point_opttol = 1e-06;
  this->s_epsilon_multiplier = 1.0;
  return;
}

Assistant:

explicit Tolerances()
      : s_epsilon(SOPLEX_DEFAULT_EPS_ZERO), s_epsilon_factorization(SOPLEX_DEFAULT_EPS_FACTOR),
        s_epsilon_update(SOPLEX_DEFAULT_EPS_UPDATE), s_epsilon_pivot(SOPLEX_DEFAULT_EPS_PIVOR),
        s_feastol(SOPLEX_DEFAULT_BND_VIOL), s_opttol(SOPLEX_DEFAULT_BND_VIOL),
        s_floating_point_feastol(SOPLEX_DEFAULT_BND_VIOL),
        s_floating_point_opttol(SOPLEX_DEFAULT_BND_VIOL),
        s_epsilon_multiplier(1.0)
   {}